

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O0

void put_gray_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  undefined8 *puVar1;
  long in_RSI;
  long in_RDI;
  int pad;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY image_ptr;
  bmp_dest_ptr dest;
  int local_3c;
  undefined1 *local_38;
  
  if (*(int *)(in_RSI + 0x58) == 0) {
    local_38 = *(undefined1 **)(in_RSI + 0x60);
  }
  else {
    puVar1 = (undefined8 *)
             (**(code **)(*(long *)(in_RDI + 8) + 0x38))
                       (in_RDI,*(undefined8 *)(in_RSI + 0x40),*(undefined4 *)(in_RSI + 0x54),1);
    *(int *)(in_RSI + 0x54) = *(int *)(in_RSI + 0x54) + 1;
    local_38 = (undefined1 *)*puVar1;
  }
  memcpy(local_38,(void *)**(undefined8 **)(in_RSI + 0x28),(ulong)*(uint *)(in_RDI + 0x88));
  local_3c = *(int *)(in_RSI + 0x50);
  local_38 = (undefined1 *)((long)local_38 + (ulong)*(uint *)(in_RDI + 0x88));
  while (local_3c = local_3c + -1, -1 < local_3c) {
    *local_38 = 0;
    local_38 = local_38 + 1;
  }
  if (*(int *)(in_RSI + 0x58) == 0) {
    fwrite(*(void **)(in_RSI + 0x60),1,(ulong)*(uint *)(in_RSI + 0x4c),*(FILE **)(in_RSI + 0x20));
  }
  return;
}

Assistant:

METHODDEF(void)
put_gray_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
              JDIMENSION rows_supplied)
/* used for grayscale OR quantized color output */
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  MEMCOPY(outptr, inptr, cinfo->output_width);
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}